

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kparser-standard.cc
# Opt level: O0

void __thiscall
ParserBuilder::ParserBuilder
          (ParserBuilder *this,Model *model,
          unordered_map<unsigned_int,_std::vector<float,_std::allocator<float>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
          *pretrained)

{
  initializer_list<unsigned_int> x;
  initializer_list<unsigned_int> x_00;
  initializer_list<unsigned_int> x_01;
  initializer_list<unsigned_int> x_02;
  initializer_list<unsigned_int> x_03;
  initializer_list<unsigned_int> x_04;
  initializer_list<unsigned_int> x_05;
  initializer_list<unsigned_int> x_06;
  initializer_list<unsigned_int> x_07;
  initializer_list<unsigned_int> x_08;
  initializer_list<unsigned_int> x_09;
  initializer_list<unsigned_int> x_10;
  initializer_list<unsigned_int> x_11;
  initializer_list<unsigned_int> x_12;
  initializer_list<unsigned_int> x_13;
  initializer_list<unsigned_int> x_14;
  initializer_list<unsigned_int> x_15;
  initializer_list<unsigned_int> x_16;
  initializer_list<unsigned_int> x_17;
  initializer_list<unsigned_int> x_18;
  initializer_list<unsigned_int> x_19;
  initializer_list<unsigned_int> x_20;
  bool bVar1;
  LookupParameters *pLVar2;
  Parameters *pPVar3;
  LookupParameters *pLVar4;
  undefined8 in_RDX;
  Model *in_RSI;
  long in_RDI;
  value_type it;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_map<unsigned_int,_std::vector<float,_std::allocator<float>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  *__range1;
  pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_> *in_stack_fffffffffffff828;
  pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_> *in_stack_fffffffffffff830;
  Model *val;
  uint uVar5;
  Dim *in_stack_fffffffffffff850;
  undefined4 in_stack_fffffffffffff858;
  undefined4 uVar6;
  uint in_stack_fffffffffffff85c;
  uint n;
  Model *in_stack_fffffffffffff860;
  Model *this_00;
  uint local_570;
  uint local_56c;
  uint *local_568;
  undefined8 local_560;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>,_false>
  local_510;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>,_false>
  local_508;
  undefined8 local_500;
  uint local_4f4;
  uint *local_4f0;
  undefined8 local_4e8;
  uint local_4b8;
  uint local_4b4;
  uint *local_4b0;
  undefined8 local_4a8;
  uint local_47c;
  uint *local_478;
  undefined8 local_470;
  uint local_440;
  int local_43c;
  uint *local_438;
  undefined8 local_430;
  uint local_404;
  uint *local_400;
  undefined8 local_3f8;
  uint local_3cc;
  uint *local_3c8;
  undefined8 local_3c0;
  uint local_394;
  uint *local_390;
  undefined8 local_388;
  uint local_35c;
  uint *local_358;
  undefined8 local_350;
  Model *in_stack_fffffffffffffcc8;
  uint in_stack_fffffffffffffcd4;
  uint in_stack_fffffffffffffcd8;
  uint in_stack_fffffffffffffcdc;
  undefined4 in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  uint uVar7;
  uint local_2e4;
  uint *local_2e0;
  undefined8 local_2d8;
  uint local_2ac;
  uint *local_2a8;
  undefined8 local_2a0;
  uint local_270;
  uint local_26c;
  uint *local_268;
  undefined8 local_260;
  uint local_230;
  uint local_22c;
  uint *local_228;
  undefined8 local_220;
  uint local_1f0;
  uint local_1ec;
  uint *local_1e8;
  undefined8 local_1e0;
  uint local_1b0;
  uint local_1ac;
  uint *local_1a8;
  undefined8 local_1a0;
  uint local_174;
  uint *local_170;
  undefined8 local_168;
  uint local_13c;
  uint *local_138;
  undefined8 local_130;
  uint local_104;
  uint *local_100;
  undefined8 local_f8;
  uint local_cc;
  uint *local_c8;
  undefined8 local_c0;
  uint local_94;
  uint *local_90;
  undefined8 local_88;
  uint local_5c;
  uint *local_58;
  undefined8 local_50;
  undefined8 local_18;
  Model *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  cnn::LSTMBuilder::LSTMBuilder
            ((LSTMBuilder *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
             in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd4,
             in_stack_fffffffffffffcc8);
  cnn::LSTMBuilder::LSTMBuilder
            ((LSTMBuilder *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
             in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd4,
             in_stack_fffffffffffffcc8);
  cnn::LSTMBuilder::LSTMBuilder
            ((LSTMBuilder *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
             in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd4,
             in_stack_fffffffffffffcc8);
  cnn::LSTMBuilder::LSTMBuilder
            ((LSTMBuilder *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
             in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd4,
             in_stack_fffffffffffffcc8);
  local_5c = INPUT_DIM;
  local_58 = &local_5c;
  local_50 = 1;
  x._M_array._4_4_ = in_stack_fffffffffffff85c;
  x._M_array._0_4_ = in_stack_fffffffffffff858;
  x._M_len = (size_type)in_stack_fffffffffffff860;
  cnn::Dim::Dim(in_stack_fffffffffffff850,x);
  pLVar2 = cnn::Model::add_lookup_parameters
                     (in_stack_fffffffffffff860,in_stack_fffffffffffff85c,in_stack_fffffffffffff850)
  ;
  *(LookupParameters **)(in_RDI + 0x328) = pLVar2;
  local_94 = INPUT_DIM;
  local_90 = &local_94;
  local_88 = 1;
  x_00._M_array._4_4_ = in_stack_fffffffffffff85c;
  x_00._M_array._0_4_ = in_stack_fffffffffffff858;
  x_00._M_len = (size_type)in_stack_fffffffffffff860;
  cnn::Dim::Dim(in_stack_fffffffffffff850,x_00);
  pLVar2 = cnn::Model::add_lookup_parameters
                     (in_stack_fffffffffffff860,in_stack_fffffffffffff85c,in_stack_fffffffffffff850)
  ;
  *(LookupParameters **)(in_RDI + 0x330) = pLVar2;
  local_cc = LSTM_INPUT_DIM;
  local_c8 = &local_cc;
  local_c0 = 1;
  x_01._M_array._4_4_ = in_stack_fffffffffffff85c;
  x_01._M_array._0_4_ = in_stack_fffffffffffff858;
  x_01._M_len = (size_type)in_stack_fffffffffffff860;
  cnn::Dim::Dim(in_stack_fffffffffffff850,x_01);
  pLVar2 = cnn::Model::add_lookup_parameters
                     (in_stack_fffffffffffff860,in_stack_fffffffffffff85c,in_stack_fffffffffffff850)
  ;
  *(LookupParameters **)(in_RDI + 0x338) = pLVar2;
  local_104 = LSTM_INPUT_DIM;
  local_100 = &local_104;
  local_f8 = 1;
  x_02._M_array._4_4_ = in_stack_fffffffffffff85c;
  x_02._M_array._0_4_ = in_stack_fffffffffffff858;
  x_02._M_len = (size_type)in_stack_fffffffffffff860;
  cnn::Dim::Dim(in_stack_fffffffffffff850,x_02);
  pLVar2 = cnn::Model::add_lookup_parameters
                     (in_stack_fffffffffffff860,in_stack_fffffffffffff85c,in_stack_fffffffffffff850)
  ;
  *(LookupParameters **)(in_RDI + 0x340) = pLVar2;
  local_13c = ACTION_DIM;
  local_138 = &local_13c;
  local_130 = 1;
  x_03._M_array._4_4_ = in_stack_fffffffffffff85c;
  x_03._M_array._0_4_ = in_stack_fffffffffffff858;
  x_03._M_len = (size_type)in_stack_fffffffffffff860;
  cnn::Dim::Dim(in_stack_fffffffffffff850,x_03);
  pLVar2 = cnn::Model::add_lookup_parameters
                     (in_stack_fffffffffffff860,in_stack_fffffffffffff85c,in_stack_fffffffffffff850)
  ;
  *(LookupParameters **)(in_RDI + 0x348) = pLVar2;
  local_174 = HIDDEN_DIM;
  local_170 = &local_174;
  local_168 = 1;
  x_04._M_array._4_4_ = in_stack_fffffffffffff85c;
  x_04._M_array._0_4_ = in_stack_fffffffffffff858;
  x_04._M_len = (size_type)in_stack_fffffffffffff860;
  cnn::Dim::Dim(in_stack_fffffffffffff850,x_04);
  pPVar3 = cnn::Model::add_parameters
                     (in_stack_fffffffffffff860,
                      (Dim *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                      (float)((ulong)in_stack_fffffffffffff850 >> 0x20));
  *(Parameters **)(in_RDI + 0x370) = pPVar3;
  local_1b0 = HIDDEN_DIM;
  local_1ac = HIDDEN_DIM;
  local_1a8 = &local_1b0;
  local_1a0 = 2;
  x_05._M_array._4_4_ = in_stack_fffffffffffff85c;
  x_05._M_array._0_4_ = in_stack_fffffffffffff858;
  x_05._M_len = (size_type)in_stack_fffffffffffff860;
  cnn::Dim::Dim(in_stack_fffffffffffff850,x_05);
  pPVar3 = cnn::Model::add_parameters
                     (in_stack_fffffffffffff860,
                      (Dim *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                      (float)((ulong)in_stack_fffffffffffff850 >> 0x20));
  *(Parameters **)(in_RDI + 0x378) = pPVar3;
  local_1f0 = HIDDEN_DIM;
  local_1ec = HIDDEN_DIM;
  local_1e8 = &local_1f0;
  local_1e0 = 2;
  x_06._M_array._4_4_ = in_stack_fffffffffffff85c;
  x_06._M_array._0_4_ = in_stack_fffffffffffff858;
  x_06._M_len = (size_type)in_stack_fffffffffffff860;
  cnn::Dim::Dim(in_stack_fffffffffffff850,x_06);
  pPVar3 = cnn::Model::add_parameters
                     (in_stack_fffffffffffff860,
                      (Dim *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                      (float)((ulong)in_stack_fffffffffffff850 >> 0x20));
  *(Parameters **)(in_RDI + 0x380) = pPVar3;
  local_230 = HIDDEN_DIM;
  local_22c = HIDDEN_DIM;
  local_228 = &local_230;
  local_220 = 2;
  x_07._M_array._4_4_ = in_stack_fffffffffffff85c;
  x_07._M_array._0_4_ = in_stack_fffffffffffff858;
  x_07._M_len = (size_type)in_stack_fffffffffffff860;
  cnn::Dim::Dim(in_stack_fffffffffffff850,x_07);
  pPVar3 = cnn::Model::add_parameters
                     (in_stack_fffffffffffff860,
                      (Dim *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                      (float)((ulong)in_stack_fffffffffffff850 >> 0x20));
  *(Parameters **)(in_RDI + 0x388) = pPVar3;
  local_270 = LSTM_INPUT_DIM;
  local_26c = INPUT_DIM;
  local_268 = &local_270;
  local_260 = 2;
  x_08._M_array._4_4_ = in_stack_fffffffffffff85c;
  x_08._M_array._0_4_ = in_stack_fffffffffffff858;
  x_08._M_len = (size_type)in_stack_fffffffffffff860;
  cnn::Dim::Dim(in_stack_fffffffffffff850,x_08);
  pPVar3 = cnn::Model::add_parameters
                     (in_stack_fffffffffffff860,
                      (Dim *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                      (float)((ulong)in_stack_fffffffffffff850 >> 0x20));
  *(Parameters **)(in_RDI + 0x390) = pPVar3;
  local_2ac = LSTM_INPUT_DIM;
  local_2a8 = &local_2ac;
  local_2a0 = 1;
  x_09._M_array._4_4_ = in_stack_fffffffffffff85c;
  x_09._M_array._0_4_ = in_stack_fffffffffffff858;
  x_09._M_len = (size_type)in_stack_fffffffffffff860;
  cnn::Dim::Dim(in_stack_fffffffffffff850,x_09);
  pPVar3 = cnn::Model::add_parameters
                     (in_stack_fffffffffffff860,
                      (Dim *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                      (float)((ulong)in_stack_fffffffffffff850 >> 0x20));
  *(Parameters **)(in_RDI + 0x3a0) = pPVar3;
  local_2e4 = LSTM_INPUT_DIM;
  local_2e0 = &local_2e4;
  local_2d8 = 1;
  x_10._M_array._4_4_ = in_stack_fffffffffffff85c;
  x_10._M_array._0_4_ = in_stack_fffffffffffff858;
  x_10._M_len = (size_type)in_stack_fffffffffffff860;
  cnn::Dim::Dim(in_stack_fffffffffffff850,x_10);
  pPVar3 = cnn::Model::add_parameters
                     (in_stack_fffffffffffff860,
                      (Dim *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                      (float)((ulong)in_stack_fffffffffffff850 >> 0x20));
  *(Parameters **)(in_RDI + 0x3a8) = pPVar3;
  x_11._M_array._4_4_ = in_stack_fffffffffffff85c;
  x_11._M_array._0_4_ = in_stack_fffffffffffff858;
  x_11._M_len = (size_type)in_stack_fffffffffffff860;
  uVar5 = ACTION_SIZE;
  uVar7 = HIDDEN_DIM;
  cnn::Dim::Dim(in_stack_fffffffffffff850,x_11);
  pPVar3 = cnn::Model::add_parameters
                     (in_stack_fffffffffffff860,
                      (Dim *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                      (float)((ulong)in_stack_fffffffffffff850 >> 0x20));
  *(Parameters **)(in_RDI + 0x3b0) = pPVar3;
  local_35c = ACTION_DIM;
  local_358 = &local_35c;
  local_350 = 1;
  x_12._M_array._4_4_ = in_stack_fffffffffffff85c;
  x_12._M_array._0_4_ = in_stack_fffffffffffff858;
  x_12._M_len = (size_type)in_stack_fffffffffffff860;
  cnn::Dim::Dim(in_stack_fffffffffffff850,x_12);
  pPVar3 = cnn::Model::add_parameters
                     (in_stack_fffffffffffff860,
                      (Dim *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                      (float)((ulong)in_stack_fffffffffffff850 >> 0x20));
  *(Parameters **)(in_RDI + 0x3b8) = pPVar3;
  local_394 = ACTION_SIZE;
  local_390 = &local_394;
  local_388 = 1;
  x_13._M_array._4_4_ = in_stack_fffffffffffff85c;
  x_13._M_array._0_4_ = in_stack_fffffffffffff858;
  x_13._M_len = (size_type)in_stack_fffffffffffff860;
  cnn::Dim::Dim(in_stack_fffffffffffff850,x_13);
  pPVar3 = cnn::Model::add_parameters
                     (in_stack_fffffffffffff860,
                      (Dim *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                      (float)((ulong)in_stack_fffffffffffff850 >> 0x20));
  *(Parameters **)(in_RDI + 0x3c0) = pPVar3;
  local_3cc = LSTM_INPUT_DIM;
  local_3c8 = &local_3cc;
  local_3c0 = 1;
  x_14._M_array._4_4_ = in_stack_fffffffffffff85c;
  x_14._M_array._0_4_ = in_stack_fffffffffffff858;
  x_14._M_len = (size_type)in_stack_fffffffffffff860;
  cnn::Dim::Dim(in_stack_fffffffffffff850,x_14);
  pPVar3 = cnn::Model::add_parameters
                     (in_stack_fffffffffffff860,
                      (Dim *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                      (float)((ulong)in_stack_fffffffffffff850 >> 0x20));
  *(Parameters **)(in_RDI + 0x3c8) = pPVar3;
  local_404 = LSTM_INPUT_DIM;
  local_400 = &local_404;
  local_3f8 = 1;
  x_15._M_array._4_4_ = in_stack_fffffffffffff85c;
  x_15._M_array._0_4_ = in_stack_fffffffffffff858;
  x_15._M_len = (size_type)in_stack_fffffffffffff860;
  cnn::Dim::Dim(in_stack_fffffffffffff850,x_15);
  pPVar3 = cnn::Model::add_parameters
                     (in_stack_fffffffffffff860,
                      (Dim *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                      (float)((ulong)in_stack_fffffffffffff850 >> 0x20));
  *(Parameters **)(in_RDI + 0x3d0) = pPVar3;
  local_440 = LSTM_INPUT_DIM;
  local_43c = LSTM_INPUT_DIM * 2;
  local_438 = &local_440;
  local_430 = 2;
  x_16._M_array._4_4_ = in_stack_fffffffffffff85c;
  x_16._M_array._0_4_ = in_stack_fffffffffffff858;
  x_16._M_len = (size_type)in_stack_fffffffffffff860;
  cnn::Dim::Dim(in_stack_fffffffffffff850,x_16);
  pPVar3 = cnn::Model::add_parameters
                     (in_stack_fffffffffffff860,
                      (Dim *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                      (float)((ulong)in_stack_fffffffffffff850 >> 0x20));
  *(Parameters **)(in_RDI + 0x3d8) = pPVar3;
  local_47c = POS_DIM;
  local_478 = &local_47c;
  local_470 = 1;
  x_17._M_array._4_4_ = in_stack_fffffffffffff85c;
  x_17._M_array._0_4_ = in_stack_fffffffffffff858;
  x_17._M_len = (size_type)in_stack_fffffffffffff860;
  cnn::Dim::Dim(in_stack_fffffffffffff850,x_17);
  pLVar2 = cnn::Model::add_lookup_parameters
                     (in_stack_fffffffffffff860,in_stack_fffffffffffff85c,in_stack_fffffffffffff850)
  ;
  *(LookupParameters **)(in_RDI + 0x350) = pLVar2;
  local_4b8 = LSTM_INPUT_DIM;
  local_4b4 = POS_DIM;
  local_4b0 = &local_4b8;
  local_4a8 = 2;
  x_18._M_array._4_4_ = in_stack_fffffffffffff85c;
  x_18._M_array._0_4_ = in_stack_fffffffffffff858;
  x_18._M_len = (size_type)local_10;
  this_00 = local_10;
  cnn::Dim::Dim(in_stack_fffffffffffff850,x_18);
  pPVar3 = cnn::Model::add_parameters
                     (this_00,(Dim *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                      (float)((ulong)in_stack_fffffffffffff850 >> 0x20));
  uVar6 = SUB84(pPVar3,0);
  n = (uint)((ulong)pPVar3 >> 0x20);
  *(Parameters **)(in_RDI + 0x358) = pPVar3;
  pLVar2 = (LookupParameters *)operator_new(200);
  cnn::LSTMBuilder::LSTMBuilder
            ((LSTMBuilder *)CONCAT44(uVar7,uVar5),in_stack_fffffffffffffcdc,
             in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd4,in_stack_fffffffffffffcc8);
  *(LookupParameters **)(in_RDI + 200) = pLVar2;
  local_4f4 = PRETRAINED_DIM;
  local_4f0 = &local_4f4;
  local_4e8 = 1;
  x_19._M_array._4_4_ = n;
  x_19._M_array._0_4_ = uVar6;
  x_19._M_len = (size_type)this_00;
  uVar5 = VOCAB_SIZE;
  cnn::Dim::Dim((Dim *)pLVar2,x_19);
  pLVar4 = cnn::Model::add_lookup_parameters(this_00,n,(Dim *)pLVar2);
  *(LookupParameters **)(in_RDI + 0x330) = pLVar4;
  local_500 = local_18;
  local_508._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_std::vector<float,_std::allocator<float>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
       ::begin((unordered_map<unsigned_int,_std::vector<float,_std::allocator<float>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                *)in_stack_fffffffffffff828);
  local_510._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_std::vector<float,_std::allocator<float>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
       ::end((unordered_map<unsigned_int,_std::vector<float,_std::allocator<float>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>_>_>
              *)in_stack_fffffffffffff828);
  val = local_10;
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_508,&local_510);
    if (!bVar1) break;
    std::__detail::
    _Node_const_iterator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>,_false,_false>
    ::operator*((_Node_const_iterator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>,_false,_false>
                 *)0x4583bc);
    std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>::pair
              (in_stack_fffffffffffff830,in_stack_fffffffffffff828);
    cnn::LookupParameters::Initialize(pLVar2,uVar5,(vector<float,_std::allocator<float>_> *)val);
    std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>::~pair
              ((pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_> *)0x458400);
    std::__detail::
    _Node_const_iterator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>,_false,_false>
    ::operator++((_Node_const_iterator<std::pair<const_unsigned_int,_std::vector<float,_std::allocator<float>_>_>,_false,_false>
                  *)in_stack_fffffffffffff830);
  }
  local_570 = LSTM_INPUT_DIM;
  local_56c = PRETRAINED_DIM;
  local_568 = &local_570;
  local_560 = 2;
  x_20._M_array._4_4_ = n;
  x_20._M_array._0_4_ = uVar6;
  x_20._M_len = (size_type)this_00;
  cnn::Dim::Dim((Dim *)pLVar2,x_20);
  pPVar3 = cnn::Model::add_parameters
                     (this_00,(Dim *)CONCAT44(n,uVar6),(float)((ulong)pLVar2 >> 0x20));
  *(Parameters **)(in_RDI + 0x398) = pPVar3;
  return;
}

Assistant:

explicit ParserBuilder(Model* model, const unordered_map<unsigned, vector<float>>& pretrained) :
      stack_lstm(LAYERS, LSTM_INPUT_DIM, HIDDEN_DIM, model),
      action_lstm(LAYERS, ACTION_DIM, HIDDEN_DIM, model),
      const_lstm_fwd(LAYERS, LSTM_INPUT_DIM, LSTM_INPUT_DIM, model), // used to compose children of a node into a representation of the node
      const_lstm_rev(LAYERS, LSTM_INPUT_DIM, LSTM_INPUT_DIM, model), // used to compose children of a node into a representation of the node
      p_w(model->add_lookup_parameters(VOCAB_SIZE, {INPUT_DIM})),
      p_t(model->add_lookup_parameters(VOCAB_SIZE, {INPUT_DIM})),
      p_nt(model->add_lookup_parameters(NT_SIZE, {LSTM_INPUT_DIM})),
      p_ntup(model->add_lookup_parameters(NT_SIZE, {LSTM_INPUT_DIM})),
      p_a(model->add_lookup_parameters(ACTION_SIZE, {ACTION_DIM})),
      p_pbias(model->add_parameters({HIDDEN_DIM})),
      p_A(model->add_parameters({HIDDEN_DIM, HIDDEN_DIM})),
      p_B(model->add_parameters({HIDDEN_DIM, HIDDEN_DIM})),
      p_S(model->add_parameters({HIDDEN_DIM, HIDDEN_DIM})),
      p_w2l(model->add_parameters({LSTM_INPUT_DIM, INPUT_DIM})),
      p_ib(model->add_parameters({LSTM_INPUT_DIM})),
      p_cbias(model->add_parameters({LSTM_INPUT_DIM})),
      p_p2a(model->add_parameters({ACTION_SIZE, HIDDEN_DIM})),
      p_action_start(model->add_parameters({ACTION_DIM})),
      p_abias(model->add_parameters({ACTION_SIZE})),

      p_buffer_guard(model->add_parameters({LSTM_INPUT_DIM})),
      p_stack_guard(model->add_parameters({LSTM_INPUT_DIM})),

      p_cW(model->add_parameters({LSTM_INPUT_DIM, LSTM_INPUT_DIM * 2})) {
      
      p_pos = model->add_lookup_parameters(POS_SIZE, {POS_DIM});
      p_p2w = model->add_parameters({LSTM_INPUT_DIM, POS_DIM});
    
      buffer_lstm = new LSTMBuilder(LAYERS, LSTM_INPUT_DIM, HIDDEN_DIM, model);
      
      p_t = model->add_lookup_parameters(VOCAB_SIZE, {PRETRAINED_DIM});
      for (auto it : pretrained) p_t->Initialize(it.first, it.second);
      p_t2l = model->add_parameters({LSTM_INPUT_DIM, PRETRAINED_DIM});
  }